

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.h
# Opt level: O0

void __thiscall AsyncLogging::~AsyncLogging(AsyncLogging *this)

{
  AsyncLogging *this_local;
  
  if ((this->running_ & 1U) != 0) {
    stop(this);
  }
  CountDownLatch::~CountDownLatch(&this->latch_);
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::~vector(&this->buffers_);
  std::shared_ptr<FixedBuffer<4000000>_>::~shared_ptr(&this->currentBuffer_);
  Condition::~Condition(&this->cond_);
  MutexLock::~MutexLock(&this->mutex_);
  Thread::~Thread(&this->thread_);
  std::__cxx11::string::~string((string *)&this->basename_);
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

~AsyncLogging() {
        if(running_) stop();
    }